

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidget::resize(QWidget *this,QSize *s)

{
  int iVar1;
  int iVar2;
  int iVar3;
  QWidgetPrivate *this_00;
  QWidgetData *pQVar4;
  QWExtra *pQVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  undefined8 uVar9;
  int iVar10;
  undefined8 uVar11;
  QWidgetPrivate *d;
  
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  uVar6 = this_00->high_attributes[0];
  if ((uVar6 >> 10 & 1) == 0) {
    uVar6 = uVar6 | 0x400;
    this_00->high_attributes[0] = uVar6;
  }
  if ((uVar6 >> 0x1c & 1) == 0) {
    pQVar4 = this->data;
    pQVar5 = (this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>.
             _M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
             super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
    if (pQVar5 == (QWExtra *)0x0) {
      uVar11 = 0xffffff00ffffff;
    }
    else {
      uVar11._0_4_ = pQVar5->maxw;
      uVar11._4_4_ = pQVar5->maxh;
    }
    iVar1 = (pQVar4->crect).x1.m_i;
    iVar2 = (pQVar4->crect).y1.m_i;
    iVar7 = (s->wd).m_i;
    iVar3 = (s->ht).m_i;
    if ((int)uVar11 <= iVar7) {
      iVar7 = (int)uVar11;
    }
    iVar8 = (int)((ulong)uVar11 >> 0x20);
    if (iVar3 < iVar8) {
      iVar8 = iVar3;
    }
    if (pQVar5 == (QWExtra *)0x0) {
      uVar9 = 0;
    }
    else {
      uVar9._0_4_ = pQVar5->minw;
      uVar9._4_4_ = pQVar5->minh;
    }
    if (iVar7 <= (int)uVar9) {
      iVar7 = (int)uVar9;
    }
    iVar3 = (pQVar4->crect).x2.m_i;
    iVar10 = (int)((ulong)uVar9 >> 0x20);
    if (iVar10 < iVar8) {
      iVar10 = iVar8;
    }
    iVar8 = (pQVar4->crect).y2.m_i;
    (pQVar4->crect).x2.m_i = iVar7 + iVar1 + -1;
    (pQVar4->crect).y2.m_i = iVar2 + iVar10 + -1;
    pQVar4 = this->data;
    if ((((iVar1 != (pQVar4->crect).x1.m_i) || (iVar3 != (pQVar4->crect).x2.m_i)) ||
        (iVar2 != (pQVar4->crect).y1.m_i)) || (iVar8 != (pQVar4->crect).y2.m_i)) {
      uVar6 = *(uint *)(*(long *)&this->field_0x8 + 0x240);
      if ((uVar6 & 8) == 0) {
        *(uint *)(*(long *)&this->field_0x8 + 0x240) = uVar6 | 8;
      }
    }
    return;
  }
  QWidgetPrivate::fixPosIncludesFrame(this_00);
  QWidgetPrivate::setGeometry_sys
            (this_00,(this->data->crect).x1.m_i,(this->data->crect).y1.m_i,(s->wd).m_i,(s->ht).m_i,
             false);
  QWidgetPrivate::setDirtyOpaqueRegion(this_00);
  return;
}

Assistant:

void QWidget::resize(const QSize &s)
{
    Q_D(QWidget);
    setAttribute(Qt::WA_Resized);
    if (testAttribute(Qt::WA_WState_Created)) {
        d->fixPosIncludesFrame();
        d->setGeometry_sys(geometry().x(), geometry().y(), s.width(), s.height(), false);
        d->setDirtyOpaqueRegion();
    } else {
        const auto oldRect = data->crect;
        data->crect.setSize(s.boundedTo(maximumSize()).expandedTo(minimumSize()));
        if (oldRect != data->crect)
            setAttribute(Qt::WA_PendingResizeEvent);
    }
}